

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

void __thiscall nigel::Builder::Builder(Builder *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->builderTasks)._M_t._M_impl.super__Rb_tree_header;
  (this->builderTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builderTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->builderTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->builderTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->builderTasks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  loadBuilderTasks(this);
  return;
}

Assistant:

Builder::Builder()
	{
		loadBuilderTasks();
	}